

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

CTPNStmComp * __thiscall
CTcParser::parse_compound
          (CTcParser *this,int *err,int skip_lbrace,int need_rbrace,CTPNStmSwitch *enclosing_switch,
          int use_enclosing_scope)

{
  tc_toktyp_t tVar1;
  int iVar2;
  CTcTokFileDesc *pCVar3;
  long lVar4;
  CTcPrsSymtab *pCVar5;
  bool bVar6;
  CTcTokenizer *pCVar7;
  CTcTokFileDesc *pCVar8;
  CTcTokFileDesc *this_00;
  CTPNStmBase *this_01;
  byte bVar9;
  int *siz;
  CTcTokFileDesc *pCVar10;
  CTcTokFileDesc *pCVar11;
  CTcTokFileDesc *pCVar12;
  CTcPrsSymtab *local_50;
  CTcPrsSymtab *local_48;
  
  pCVar3 = G_tok->last_desc_;
  lVar4 = G_tok->last_linenum_;
  siz = err;
  if ((skip_lbrace != 0) && ((G_tok->curtok_).typ_ == TOKT_LBRACE)) {
    CTcTokenizer::next(G_tok);
  }
  if (use_enclosing_scope == 0) {
    local_48 = this->local_symtab_;
    local_50 = this->enclosing_local_symtab_;
    this->enclosing_local_symtab_ = local_48;
  }
  this_00 = (CTcTokFileDesc *)0x0;
  pCVar11 = (CTcTokFileDesc *)0x0;
  while( true ) {
    tVar1 = (G_tok->curtok_).typ_;
    if (tVar1 == TOKT_RBRACE) {
      bVar6 = false;
      goto LAB_002017e0;
    }
    if (tVar1 == TOKT_EOF) break;
    siz = err;
    pCVar8 = (CTcTokFileDesc *)parse_stm(this,err,enclosing_switch,0);
    iVar2 = *err;
    pCVar10 = this_00;
    pCVar12 = pCVar11;
    if ((pCVar8 != (CTcTokFileDesc *)0x0) &&
       (pCVar10 = pCVar8, pCVar12 = pCVar8, pCVar11 != (CTcTokFileDesc *)0x0)) {
      pCVar11->fname_ = (char *)pCVar8;
      pCVar10 = this_00;
    }
    this_00 = pCVar10;
    pCVar11 = pCVar12;
    if (iVar2 != 0) {
      bVar6 = true;
LAB_002017e0:
      if (this_00 == (CTcTokFileDesc *)0x0) {
        this_00 = (CTcTokFileDesc *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x20,(size_t)siz)
        ;
        CTPNStmBase::CTPNStmBase((CTPNStmBase *)this_00);
        *(undefined ***)this_00 = &PTR_gen_code_00313e58;
      }
      this_01 = (CTPNStmBase *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x48,(size_t)siz);
      pCVar5 = this->local_symtab_;
      CTPNStmBase::CTPNStmBase(this_01);
      (this_01->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           (_func_int **)&PTR_gen_code_00311f18;
      this_01[1].file_ = this_00;
      this_01[1].linenum_ = (long)pCVar5;
      bVar9 = *(byte *)&this_01[2].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 0xfe
      ;
      *(byte *)&this_01[2].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = bVar9;
      pCVar7 = G_tok;
      this_01[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           (_func_int **)G_tok->last_desc_;
      this_01[1].next_stm_ = (CTPNStm *)pCVar7->last_linenum_;
      (this_01->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           (_func_int **)&PTR_gen_code_00313d38;
      this_01->file_ = pCVar3;
      this_01->linenum_ = lVar4;
      *(byte *)&this_01[2].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           (this->local_symtab_ != local_48 && use_enclosing_scope == 0) | bVar9;
      if (!bVar6) {
        CTcTokenizer::next(G_tok);
      }
      if (use_enclosing_scope == 0) {
        this->local_symtab_ = local_48;
        this->enclosing_local_symtab_ = local_50;
      }
      return (CTPNStmComp *)this_01;
    }
  }
  bVar6 = true;
  if (need_rbrace != 0) {
    CTcTokenizer::log_error(0x2b22);
  }
  goto LAB_002017e0;
}

Assistant:

CTPNStmComp *CTcParser::parse_compound(
    int *err, int skip_lbrace, int need_rbrace,
    CTPNStmSwitch *enclosing_switch, int use_enclosing_scope)
{
    /* save the current line information for later */
    CTcTokFileDesc *file;
    long linenum;
    G_tok->get_last_pos(&file, &linenum);

    /* skip the '{' if we're on one and the caller wants us to */
    if (skip_lbrace && G_tok->cur() == TOKT_LBRACE)
        G_tok->next();

    /* enter a scope */
    tcprs_scope_t scope_data;
    if (!use_enclosing_scope)
        enter_scope(&scope_data);

    /* we don't have any statements in our sublist yet */
    CTPNStm *first_stm = 0;
    CTPNStm *last_stm = 0;
    CTPNStm *cur_stm = 0;

    /* presume we won't find the closing brace */
    int skip_rbrace = FALSE;

    /* keep going until we reach the closing '}' */
    for (int done = FALSE ; !done ; )
    {
        /* check what we've found */
        switch (G_tok->cur())
        {
        case TOKT_RBRACE:
            /* it's our closing brace - we're done */
            done = TRUE;
            cur_stm = 0;

            /* note that we must still skip the closing brace */
            skip_rbrace = TRUE;

            /* stop scanning statements */
            break;

        case TOKT_EOF:
            /* 
             *   if we're at end of file, and we don't need a right brace to
             *   end the block, consider this the end of the block 
             */
            if (!need_rbrace)
            {
                done = TRUE;
                cur_stm = 0;
                skip_rbrace = FALSE;
                break;
            }
            else
            {
                /* it's an error */
                G_tok->log_error(TCERR_EOF_IN_CODE);
                cur_stm = 0;
                done = TRUE;
                break;
            }
            break;

        default:
            /* parse a statement */
            cur_stm = parse_stm(err, enclosing_switch, FALSE);

            /* if an error occurred, stop parsing */
            if (*err)
                done = TRUE;
            break;
        }

        /* if we parsed a statement, add it to our list */
        if (cur_stm != 0)
        {
            /* link the statement at the end of our list */
            if (last_stm != 0)
                last_stm->set_next_stm(cur_stm);
            else
                first_stm = cur_stm;
            last_stm = cur_stm;
        }
    }

    /* if there's no statement, make the body a null statement */
    if (first_stm == 0)
        first_stm = new CTPNStmNull();

    /* build the compound statement node */
    CTPNStmComp *comp_stm = new CTPNStmComp(first_stm, local_symtab_);

    /* set some additional information if we created a statement */
    if (comp_stm != 0)
    {
        /* set the statement's line to the start of the compound */
        comp_stm->set_source_pos(file, linenum);

        /* note whether or not we have our own private scope */
        comp_stm->set_has_own_scope(!use_enclosing_scope
                                    && (local_symtab_
                                        != scope_data.local_symtab));
    }

    /* if necessary, skip the closing brace */
    if (skip_rbrace)
        G_tok->next();

    /* leave the local scope */
    if (!use_enclosing_scope)
        leave_scope(&scope_data);

    /* return the compound statement object */
    return comp_stm;
}